

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall GEO::ProgressTask::~ProgressTask(ProgressTask *this)

{
  pointer pcVar1;
  long lVar2;
  ProgressClient *pPVar3;
  string local_58;
  string local_38;
  
  this->_vptr_ProgressTask = (_func_int **)&PTR__ProgressTask_001a8788;
  if (this->quiet_ == false) {
    if (::(anonymous_namespace)::progress_tasks_._48_8_ ==
        ::(anonymous_namespace)::progress_tasks_._16_8_) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"!progress_tasks_.empty()","");
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,"");
      geo_assertion_failed(&local_38,&local_58,0x1878);
    }
    lVar2 = ::(anonymous_namespace)::progress_tasks_._48_8_;
    if (::(anonymous_namespace)::progress_tasks_._48_8_ ==
        ::(anonymous_namespace)::progress_tasks_._56_8_) {
      lVar2 = *(long *)(::(anonymous_namespace)::progress_tasks_._72_8_ + -8) + 0x200;
    }
    if (*(ProgressTask **)(lVar2 + -8) != this) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"progress_tasks_.top() == task","");
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,"");
      geo_assertion_failed(&local_38,&local_58,0x1879);
    }
    if (::(anonymous_namespace)::progress_client_ != 0) {
      pPVar3 = SmartPointer<GEO::ProgressClient>::operator->
                         ((SmartPointer<GEO::ProgressClient> *)
                          &::(anonymous_namespace)::progress_client_);
      (*(pPVar3->super_Counted)._vptr_Counted[4])
                (pPVar3,(ulong)::(anonymous_namespace)::task_canceled_);
    }
    std::deque<const_GEO::ProgressTask_*,_std::allocator<const_GEO::ProgressTask_*>_>::pop_back
              ((deque<const_GEO::ProgressTask_*,_std::allocator<const_GEO::ProgressTask_*>_> *)
               ::(anonymous_namespace)::progress_tasks_);
    if (::(anonymous_namespace)::progress_tasks_._48_8_ ==
        ::(anonymous_namespace)::progress_tasks_._16_8_) {
      ::(anonymous_namespace)::task_canceled_ = 0;
    }
  }
  pcVar1 = (this->task_name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->task_name_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

ProgressTask::~ProgressTask() {
        if(!quiet_) {
            end_task(this);
        }
    }